

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

void __thiscall
TesterThread::TesterThread
          (TesterThread *this,
          vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
          *all_threads,int id)

{
  long lVar1;
  
  this->_vptr_TesterThread = (_func_int **)&PTR__TesterThread_00162e38;
  this->all_threads_ = all_threads;
  (this->lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->id_ = id;
  (this->rnd_).super_TestHarness.types_.
  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rnd_).super_TestHarness.types_.
  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rnd_).super_TestHarness.types_.
  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rnd_).super_TestHarness.total_weight_ = 0;
  (this->rnd_).super_TestHarness.num_tests_ = 0;
  srandom(id + 1);
  (this->rnd_)._vptr_AllocatorState = (_func_int **)&PTR__AllocatorState_00162d20;
  (this->rnd_).memalign_fraction_ = 0.0;
  lVar1 = random();
  (this->rnd_).memalign_fraction_ =
       ((double)((int)lVar1 +
                ((int)(SUB168(SEXT816(lVar1) * SEXT816(0x346dc5d63886594b),8) >> 0xb) -
                (SUB164(SEXT816(lVar1) * SEXT816(0x346dc5d63886594b),0xc) >> 0x1f)) * -10000) /
       10000.0) * 0.4 + 0.0;
  (this->heap_).super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap_).super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heap_).super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->passed_).super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->passed_).super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->passed_).super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->heap_size_ = 0;
  return;
}

Assistant:

TesterThread(std::vector<std::unique_ptr<TesterThread>>& all_threads, int id)
    : all_threads_(all_threads),
      id_(id),
      rnd_(id+1),
      heap_size_(0) {
  }